

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::AddToActive(LinearScan *this,Lifetime *lifetime)

{
  RegNum RVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  AddLiveRange(this->activeLiveranges,lifetime);
  RVar1 = lifetime->reg;
  this->regContent[RVar1] = lifetime;
  uVar2 = *(uint *)&lifetime->field_0x9c;
  BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
  if ((uVar2 >> 9 & 1) == 0) {
    if (((this->secondChanceRegs).word >> ((ulong)RVar1 & 0x3f) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x2bf,"(!this->secondChanceRegs.Test(lifetime->reg))",
                         "!this->secondChanceRegs.Test(lifetime->reg)");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
  }
  else {
    (this->secondChanceRegs).word =
         (this->secondChanceRegs).word | 1L << (RVar1 & (RegXMM15|RegXMM14));
  }
  return;
}

Assistant:

void
LinearScan::AddToActive(Lifetime * lifetime)
{
    LinearScan::AddLiveRange(this->activeLiveranges, lifetime);
    this->regContent[lifetime->reg] = lifetime;
    if (lifetime->isSecondChanceAllocated)
    {
        this->secondChanceRegs.Set(lifetime->reg);
    }
    else
    {
        Assert(!this->secondChanceRegs.Test(lifetime->reg));
    }
}